

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

strbuf * ppk_save_sb(ssh2_userkey *key,char *passphrase,ppk_save_parameters *params_orig)

{
  undefined8 ciphertype_00;
  int iVar1;
  uint uVar2;
  strbuf *sb;
  strbuf *sb_00;
  void *__s;
  strbuf *buf_o;
  void *buf;
  strbuf *storage;
  ssh2_macalg *alg;
  strbuf *psVar3;
  char *pcVar4;
  ptrlen pVar5;
  ptrlen passphrase_salt_00;
  char *local_1c8;
  char *local_180;
  ulong local_158;
  size_t i_1;
  strbuf *out;
  strbuf *macdata;
  ssh2_macalg *macalg;
  strbuf *passphrase_salt;
  ppk_save_parameters params;
  byte local_b8 [8];
  uchar priv_mac [32];
  ppk_cipher *ciphertype;
  ptrlen mackey;
  ptrlen cipheriv;
  ptrlen cipherkey;
  char *cipherstr;
  int local_50;
  int i;
  int cipherblk;
  int priv_encrypted_len;
  uchar *priv_blob_encrypted;
  strbuf *cipher_mac_keys_blob;
  strbuf *priv_blob;
  strbuf *pub_blob;
  ppk_save_parameters *params_orig_local;
  char *passphrase_local;
  ssh2_userkey *key_local;
  
  sb = strbuf_new();
  ssh_key_public_blob(key->key,sb->binarysink_);
  sb_00 = strbuf_new_nm();
  ssh_key_private_blob(key->key,sb_00->binarysink_);
  if (passphrase == (char *)0x0) {
    cipherkey.len = (size_t)anon_var_dwarf_5035;
    local_50 = 1;
    priv_mac._24_8_ = &ppk_cipher_none;
  }
  else {
    cipherkey.len = (size_t)anon_var_dwarf_502a;
    local_50 = 0x10;
    priv_mac._24_8_ = &ppk_cipher_aes256_cbc;
  }
  iVar1 = (int)sb_00->len + local_50 + -1;
  iVar1 = iVar1 - iVar1 % local_50;
  __s = safemalloc((long)iVar1,1,0);
  memset(__s,0,(long)iVar1);
  memcpy(__s,sb_00->u,sb_00->len);
  join_0x00000010_0x00000000_ = ptrlen_from_strbuf(sb_00);
  hash_simple(&ssh_sha1,join_0x00000010_0x00000000_,local_b8);
  if (0x13 < (long)iVar1 - sb_00->len) {
    __assert_fail("priv_encrypted_len - priv_blob->len < 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                  0x5d3,
                  "strbuf *ppk_save_sb(ssh2_userkey *, const char *, const ppk_save_parameters *)");
  }
  memcpy((void *)((long)__s + sb_00->len),local_b8,(long)iVar1 - sb_00->len);
  memcpy(&passphrase_salt,params_orig,0x28);
  buf_o = strbuf_new();
  if ((uint)passphrase_salt == 3) {
    if (params._16_8_ == 0) {
      buf = strbuf_append(buf_o,0x10);
      random_read(buf,0x10);
    }
    else {
      BinarySink_put_data(buf_o->binarysink_,(void *)params._16_8_,(size_t)params.salt);
    }
  }
  storage = strbuf_new();
  ciphertype_00 = priv_mac._24_8_;
  uVar2 = (uint)passphrase_salt;
  local_180 = passphrase;
  if (passphrase == (char *)0x0) {
    local_180 = "";
  }
  pVar5 = ptrlen_from_asciz(local_180);
  passphrase_salt_00 = ptrlen_from_strbuf(buf_o);
  ssh2_ppk_derive_keys
            (uVar2,(ppk_cipher *)ciphertype_00,pVar5,storage,(ptrlen *)&cipheriv.len,
             (ptrlen *)&mackey.len,(ptrlen *)&ciphertype,passphrase_salt_00,
             (ppk_save_parameters *)&passphrase_salt);
  alg = &ssh_hmac_sha256;
  if ((uint)passphrase_salt == 2) {
    alg = &ssh_hmac_sha1;
  }
  psVar3 = strbuf_new_nm();
  pcVar4 = ssh_key_ssh_id(key->key);
  BinarySink_put_stringz(psVar3->binarysink_,pcVar4);
  BinarySink_put_stringz(psVar3->binarysink_,(char *)cipherkey.len);
  BinarySink_put_stringz(psVar3->binarysink_,key->comment);
  BinarySink_put_string(psVar3->binarysink_,sb->s,sb->len);
  BinarySink_put_string(psVar3->binarysink_,__s,(long)iVar1);
  pVar5 = ptrlen_from_strbuf(psVar3);
  mac_simple(alg,_ciphertype,pVar5,local_b8);
  strbuf_free(psVar3);
  if (passphrase != (char *)0x0) {
    if (cipherkey.ptr != (void *)0x20) {
      __assert_fail("cipherkey.len == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                    0x5ff,
                    "strbuf *ppk_save_sb(ssh2_userkey *, const char *, const ppk_save_parameters *)"
                   );
    }
    aes256_encrypt_pubkey((void *)cipheriv.len,(void *)mackey.len,__s,iVar1);
  }
  psVar3 = strbuf_new_nm();
  uVar2 = (uint)passphrase_salt;
  pcVar4 = ssh_key_ssh_id(key->key);
  BinarySink_put_fmt(psVar3->binarysink_,"PuTTY-User-Key-File-%u: %s\n",(ulong)uVar2,pcVar4);
  BinarySink_put_fmt(psVar3->binarysink_,"Encryption: %s\n",cipherkey.len);
  BinarySink_put_fmt(psVar3->binarysink_,"Comment: %s\n",key->comment);
  uVar2 = base64_lines((int)sb->len);
  BinarySink_put_fmt(psVar3->binarysink_,"Public-Lines: %d\n",(ulong)uVar2);
  pVar5 = ptrlen_from_strbuf(sb);
  base64_encode_bs(psVar3->binarysink_,pVar5,0x40);
  if (((uint)passphrase_salt == 3) && (*(long *)(priv_mac._24_8_ + 0x10) != 0)) {
    if (passphrase_salt._4_4_ == 0) {
      local_1c8 = "Argon2d";
    }
    else {
      local_1c8 = "Argon2id";
      if (passphrase_salt._4_4_ == 1) {
        local_1c8 = "Argon2i";
      }
    }
    BinarySink_put_fmt(psVar3->binarysink_,"Key-Derivation: %s\n",local_1c8);
    BinarySink_put_fmt(psVar3->binarysink_,"Argon2-Memory: %u\n",(ulong)params.fmt_version);
    if (((undefined1)params.argon2_flavour & Argon2i) != Argon2d) {
      __assert_fail("!params.argon2_passes_auto",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                    0x610,
                    "strbuf *ppk_save_sb(ssh2_userkey *, const char *, const ppk_save_parameters *)"
                   );
    }
    BinarySink_put_fmt(psVar3->binarysink_,"Argon2-Passes: %u\n",(ulong)params.argon2_mem);
    BinarySink_put_fmt(psVar3->binarysink_,"Argon2-Parallelism: %u\n",(ulong)(uint)params._12_4_);
    BinarySink_put_fmt(psVar3->binarysink_,"Argon2-Salt: ");
    for (local_158 = 0; local_158 < buf_o->len; local_158 = local_158 + 1) {
      BinarySink_put_fmt(psVar3->binarysink_,"%02x",(ulong)buf_o->u[local_158]);
    }
    BinarySink_put_fmt(psVar3->binarysink_,"\n");
  }
  uVar2 = base64_lines(iVar1);
  BinarySink_put_fmt(psVar3->binarysink_,"Private-Lines: %d\n",(ulong)uVar2);
  pVar5 = make_ptrlen(__s,(long)iVar1);
  base64_encode_bs(psVar3->binarysink_,pVar5,0x40);
  BinarySink_put_fmt(psVar3->binarysink_,"Private-MAC: ");
  for (cipherstr._4_4_ = 0; cipherstr._4_4_ < alg->len; cipherstr._4_4_ = cipherstr._4_4_ + 1) {
    BinarySink_put_fmt(psVar3->binarysink_,"%02x",(ulong)local_b8[cipherstr._4_4_]);
  }
  BinarySink_put_fmt(psVar3->binarysink_,"\n");
  strbuf_free(storage);
  strbuf_free(buf_o);
  strbuf_free(sb);
  strbuf_free(sb_00);
  smemclr(__s,(long)iVar1);
  safefree(__s);
  return psVar3;
}

Assistant:

strbuf *ppk_save_sb(ssh2_userkey *key, const char *passphrase,
                    const ppk_save_parameters *params_orig)
{
    strbuf *pub_blob, *priv_blob, *cipher_mac_keys_blob;
    unsigned char *priv_blob_encrypted;
    int priv_encrypted_len;
    int cipherblk;
    int i;
    const char *cipherstr;
    ptrlen cipherkey, cipheriv, mackey;
    const struct ppk_cipher *ciphertype;
    unsigned char priv_mac[32];

    /*
     * Fetch the key component blobs.
     */
    pub_blob = strbuf_new();
    ssh_key_public_blob(key->key, BinarySink_UPCAST(pub_blob));
    priv_blob = strbuf_new_nm();
    ssh_key_private_blob(key->key, BinarySink_UPCAST(priv_blob));

    /*
     * Determine encryption details, and encrypt the private blob.
     */
    if (passphrase) {
        cipherstr = "aes256-cbc";
        cipherblk = 16;
        ciphertype = &ppk_cipher_aes256_cbc;
    } else {
        cipherstr = "none";
        cipherblk = 1;
        ciphertype = &ppk_cipher_none;
    }
    priv_encrypted_len = priv_blob->len + cipherblk - 1;
    priv_encrypted_len -= priv_encrypted_len % cipherblk;
    priv_blob_encrypted = snewn(priv_encrypted_len, unsigned char);
    memset(priv_blob_encrypted, 0, priv_encrypted_len);
    memcpy(priv_blob_encrypted, priv_blob->u, priv_blob->len);
    /* Create padding based on the SHA hash of the unpadded blob. This prevents
     * too easy a known-plaintext attack on the last block. */
    hash_simple(&ssh_sha1, ptrlen_from_strbuf(priv_blob), priv_mac);
    assert(priv_encrypted_len - priv_blob->len < 20);
    memcpy(priv_blob_encrypted + priv_blob->len, priv_mac,
           priv_encrypted_len - priv_blob->len);

    /* Copy the save parameters, so that when derive_keys chooses the
     * number of Argon2 passes, it can write the result back to our
     * copy for us to retrieve. */
    ppk_save_parameters params = *params_orig;

    strbuf *passphrase_salt = strbuf_new();

    if (params.fmt_version == 3) {
        /* Invent a salt for the password hash. */
        if (params.salt)
            put_data(passphrase_salt, params.salt, params.saltlen);
        else
            random_read(strbuf_append(passphrase_salt, 16), 16);
    }

    cipher_mac_keys_blob = strbuf_new();
    ssh2_ppk_derive_keys(params.fmt_version, ciphertype,
                         ptrlen_from_asciz(passphrase ? passphrase : ""),
                         cipher_mac_keys_blob, &cipherkey, &cipheriv, &mackey,
                         ptrlen_from_strbuf(passphrase_salt), &params);

    const ssh2_macalg *macalg = (params.fmt_version == 2 ?
                                 &ssh_hmac_sha1 : &ssh_hmac_sha256);

    /* Now create the MAC. */
    {
        strbuf *macdata;

        macdata = strbuf_new_nm();
        put_stringz(macdata, ssh_key_ssh_id(key->key));
        put_stringz(macdata, cipherstr);
        put_stringz(macdata, key->comment);
        put_string(macdata, pub_blob->s, pub_blob->len);
        put_string(macdata, priv_blob_encrypted, priv_encrypted_len);

        mac_simple(macalg, mackey, ptrlen_from_strbuf(macdata), priv_mac);
        strbuf_free(macdata);
    }

    if (passphrase) {
        assert(cipherkey.len == 32);
        aes256_encrypt_pubkey(cipherkey.ptr, cipheriv.ptr,
                              priv_blob_encrypted, priv_encrypted_len);
    }

    strbuf *out = strbuf_new_nm();
    put_fmt(out, "PuTTY-User-Key-File-%u: %s\n",
            params.fmt_version, ssh_key_ssh_id(key->key));
    put_fmt(out, "Encryption: %s\n", cipherstr);
    put_fmt(out, "Comment: %s\n", key->comment);
    put_fmt(out, "Public-Lines: %d\n", base64_lines(pub_blob->len));
    base64_encode_bs(BinarySink_UPCAST(out), ptrlen_from_strbuf(pub_blob), 64);
    if (params.fmt_version == 3 && ciphertype->keylen != 0) {
        put_fmt(out, "Key-Derivation: %s\n",
                params.argon2_flavour == Argon2d ? "Argon2d" :
                params.argon2_flavour == Argon2i ? "Argon2i" : "Argon2id");
        put_fmt(out, "Argon2-Memory: %"PRIu32"\n", params.argon2_mem);
        assert(!params.argon2_passes_auto);
        put_fmt(out, "Argon2-Passes: %"PRIu32"\n", params.argon2_passes);
        put_fmt(out, "Argon2-Parallelism: %"PRIu32"\n",
                params.argon2_parallelism);
        put_fmt(out, "Argon2-Salt: ");
        for (size_t i = 0; i < passphrase_salt->len; i++)
            put_fmt(out, "%02x", passphrase_salt->u[i]);
        put_fmt(out, "\n");
    }
    put_fmt(out, "Private-Lines: %d\n", base64_lines(priv_encrypted_len));
    base64_encode_bs(BinarySink_UPCAST(out),
                     make_ptrlen(priv_blob_encrypted, priv_encrypted_len), 64);
    put_fmt(out, "Private-MAC: ");
    for (i = 0; i < macalg->len; i++)
        put_fmt(out, "%02x", priv_mac[i]);
    put_fmt(out, "\n");

    strbuf_free(cipher_mac_keys_blob);
    strbuf_free(passphrase_salt);
    strbuf_free(pub_blob);
    strbuf_free(priv_blob);
    smemclr(priv_blob_encrypted, priv_encrypted_len);
    sfree(priv_blob_encrypted);
    return out;
}